

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScaleProcess.cpp
# Opt level: O2

void __thiscall Assimp::ScaleProcess::applyScaling(ScaleProcess *this,aiNode *currentNode)

{
  float fVar1;
  float fVar2;
  float fVar3;
  aiMatrix4x4t<float> temp_1;
  aiMatrix4x4t<float> temp;
  aiVector3t<float> local_168;
  aiVector3t<float> local_158;
  aiQuaterniont<float> local_148;
  aiMatrix4x4t<float> local_138;
  aiMatrix4x4t<float> local_f0;
  aiMatrix4x4t<float> local_b0;
  aiMatrix4x4t<float> local_70;
  
  if (currentNode != (aiNode *)0x0) {
    local_158.x = 0.0;
    local_158.y = 0.0;
    local_158.z = 0.0;
    local_168.x = 0.0;
    local_168.y = 0.0;
    local_168.z = 0.0;
    local_148.w = 1.0;
    local_148.x = 0.0;
    local_148.y = 0.0;
    local_148.z = 0.0;
    aiMatrix4x4t<float>::Decompose(&currentNode->mTransformation,&local_168,&local_148,&local_158);
    fVar1 = this->mScale;
    fVar2 = local_158.x * fVar1;
    fVar3 = local_158.y * fVar1;
    fVar1 = fVar1 * local_158.z;
    local_70.a2 = 0.0;
    local_70.a3 = 0.0;
    local_70.a4 = 0.0;
    local_70.b1 = 0.0;
    local_70.b3 = 0.0;
    local_70.b4 = 0.0;
    local_70.c1 = 0.0;
    local_70.c2 = 0.0;
    local_70.c4 = 0.0;
    local_70.d1 = 0.0;
    local_70.d2 = 0.0;
    local_70.d3 = 0.0;
    local_70.d4 = 1.0;
    local_70.a1 = local_168.x;
    local_70.b2 = local_168.y;
    local_70.c3 = local_168.z;
    aiQuaterniont<float>::GetMatrix((aiMatrix3x3t<float> *)&local_138,&local_148);
    local_f0.a1 = local_138.a1;
    local_f0.a2 = local_138.a2;
    local_f0.a3 = local_138.a3;
    local_f0.a4 = 0.0;
    local_f0.b3 = local_138.b2;
    local_f0.b4 = 0.0;
    local_f0.c1 = local_138.b3;
    local_f0.c2 = local_138.b4;
    local_b0.a1 = 1.0;
    local_b0.a2 = 0.0;
    local_b0.a3 = 0.0;
    local_f0.c3 = local_138.c1;
    local_f0.c4 = 0.0;
    local_f0.d1 = 0.0;
    local_f0.d2 = 0.0;
    local_f0.d3 = 0.0;
    local_b0.b1 = 0.0;
    local_b0.b2 = 1.0;
    local_b0.b3 = 0.0;
    local_b0.c1 = 0.0;
    local_b0.c2 = 0.0;
    local_f0.d4 = 1.0;
    local_b0.c3 = 1.0;
    local_b0.d3 = 0.0;
    local_b0.d4 = 1.0;
    local_b0.d1 = 0.0;
    local_b0.d2 = 0.0;
    local_b0.a4 = fVar2;
    local_b0.b4 = fVar3;
    local_b0.c4 = fVar1;
    aiMatrix4x4t<float>::operator*=(&local_b0,&local_f0);
    local_138.a2 = local_b0.a2;
    local_138.a1 = local_b0.a1;
    local_138.b4 = local_b0.b4;
    local_138.b3 = local_b0.b3;
    local_138.c4 = local_b0.c4;
    local_138.c3 = local_b0.c3;
    local_138.a3 = local_b0.a3;
    local_138.a4 = local_b0.a4;
    local_138.b1 = local_b0.b1;
    local_138.b2 = local_b0.b2;
    local_138.c1 = local_b0.c1;
    local_138.c2 = local_b0.c2;
    local_138.d1 = local_b0.d1;
    local_138.d2 = local_b0.d2;
    local_138.d3 = local_b0.d3;
    local_138.d4 = local_b0.d4;
    aiMatrix4x4t<float>::operator*=(&local_138,&local_70);
    (currentNode->mTransformation).a1 = local_138.a1;
    (currentNode->mTransformation).a2 = local_138.a2;
    (currentNode->mTransformation).a3 = local_138.a3;
    (currentNode->mTransformation).a4 = local_138.a4;
    (currentNode->mTransformation).b1 = local_138.b1;
    (currentNode->mTransformation).b2 = local_138.b2;
    (currentNode->mTransformation).b3 = local_138.b3;
    (currentNode->mTransformation).b4 = local_138.b4;
    (currentNode->mTransformation).c1 = local_138.c1;
    (currentNode->mTransformation).c2 = local_138.c2;
    (currentNode->mTransformation).c3 = local_138.c3;
    (currentNode->mTransformation).c4 = local_138.c4;
    (currentNode->mTransformation).d1 = local_138.d1;
    (currentNode->mTransformation).d2 = local_138.d2;
    (currentNode->mTransformation).d3 = local_138.d3;
    (currentNode->mTransformation).d4 = local_138.d4;
  }
  return;
}

Assistant:

void ScaleProcess::applyScaling( aiNode *currentNode ) {
    if ( nullptr != currentNode ) {
        // Reconstruct matrix by transform rather than by scale 
        // This prevent scale values being changed which can
        // be meaningful in some cases 
        // like when you want the modeller to 
        // see 1:1 compatibility.
        
        aiVector3D pos, scale;
        aiQuaternion rotation;
        currentNode->mTransformation.Decompose( scale, rotation, pos);
        
        aiMatrix4x4 translation;
        aiMatrix4x4::Translation( pos * mScale, translation );
        
        aiMatrix4x4 scaling;

        // note: we do not use mScale here, this is on purpose.
        aiMatrix4x4::Scaling( scale, scaling );

        aiMatrix4x4 RotMatrix = aiMatrix4x4 (rotation.GetMatrix());

        currentNode->mTransformation = translation * RotMatrix * scaling;
    }
}